

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool __thiscall QPDF::allowPrintLowRes(QPDF *this)

{
  bool bVar1;
  int P;
  uint local_10;
  int local_c;
  
  local_10 = 0;
  bVar1 = isEncrypted(this,&local_c,(int *)&local_10);
  return (bool)(!bVar1 | (byte)((local_10 & 4) >> 2));
}

Assistant:

bool
QPDF::allowPrintLowRes()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        status = is_bit_set(P, 3);
    }
    return status;
}